

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_check_pub_priv(mbedtls_rsa_context *pub,mbedtls_rsa_context *prv)

{
  int iVar1;
  mbedtls_rsa_context *prv_local;
  mbedtls_rsa_context *pub_local;
  
  iVar1 = mbedtls_rsa_check_pubkey(pub);
  if ((iVar1 != 0) || (iVar1 = mbedtls_rsa_check_privkey(prv), iVar1 != 0)) {
    return -0x4200;
  }
  iVar1 = mbedtls_mpi_cmp_mpi(&pub->N,&prv->N);
  if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_cmp_mpi(&pub->E,&prv->E), iVar1 == 0)) {
    return 0;
  }
  return -0x4200;
}

Assistant:

int mbedtls_rsa_check_pub_priv( const mbedtls_rsa_context *pub,
                                const mbedtls_rsa_context *prv )
{
    RSA_VALIDATE_RET( pub != NULL );
    RSA_VALIDATE_RET( prv != NULL );

    if( mbedtls_rsa_check_pubkey( pub )  != 0 ||
        mbedtls_rsa_check_privkey( prv ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }

    if( mbedtls_mpi_cmp_mpi( &pub->N, &prv->N ) != 0 ||
        mbedtls_mpi_cmp_mpi( &pub->E, &prv->E ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }

    return( 0 );
}